

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

server_info * choose_server(server_info **excludes,int count)

{
  bool bVar1;
  server_info *psVar2;
  uint local_b0;
  int iStack_a4;
  _Bool found;
  int svr_count;
  int k;
  int j;
  int i;
  server_info *servers [16];
  int count_local;
  server_info **excludes_local;
  
  if (g_svr_count < 0x11) {
    local_b0 = g_svr_count;
  }
  else {
    local_b0 = 0x10;
  }
  iStack_a4 = 0;
  k = 0;
  servers[0xf]._4_4_ = count;
  do {
    if ((int)local_b0 <= k) {
      psVar2 = _choose_server((server_info **)&j,iStack_a4);
      return psVar2;
    }
    bVar1 = false;
    for (svr_count = 0; svr_count < servers[0xf]._4_4_; svr_count = svr_count + 1) {
      if (excludes[svr_count] == g_svr_cfg + k) {
        bVar1 = true;
        break;
      }
    }
    if (((!bVar1) && ((g_svr_cfg[k].flags & 0x8000) != 0)) && ((g_svr_cfg[k].flags & 0x4000) == 0))
    {
      *(server_info **)(&j + (long)iStack_a4 * 2) = g_svr_cfg + k;
      iStack_a4 = iStack_a4 + 1;
    }
    k = k + 1;
  } while( true );
}

Assistant:

static struct server_info * choose_server(struct server_info ** excludes, int count)
{
    struct server_info * servers[MAX_SERVERS];
    int i, j, k;
    int svr_count = g_svr_count <= MAX_SERVERS ? g_svr_count : MAX_SERVERS;

    k = 0;
    for (i = 0; i < svr_count; i++) {
        bool found = false;
        for (j = 0; j < count; j++)
            if (excludes[j] == g_svr_cfg + i) {
                found = true;
                break;
            }
        if (!found) {
            // Only put a server as candidate if it has been tested and is not hijacked.
            if ((g_svr_cfg[i].flags & SF_TEST_DONE) && !(g_svr_cfg[i].flags & SF_HIJACKED)) {
                servers[k] = g_svr_cfg + i;
                k += 1;
            }
        }
    }
    return _choose_server(servers, k);
}